

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.cpp
# Opt level: O1

error<idx2::err_code> idx2::ReadFile(cstr FileName,buffer *Buf)

{
  int *piVar1;
  buffer *Buf_00;
  int iVar2;
  FILE *__stream;
  name_map *pnVar3;
  size_t sVar4;
  err_code eVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  undefined8 uVar9;
  str pcVar10;
  char *pcVar11;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar12;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:33:3)>
  __ScopeGuard__1;
  undefined4 uVar13;
  buffer *local_48;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_InputOutput_cpp:33:3)>
  local_40;
  
  local_48 = Buf;
  __stream = fopen(FileName,"rb");
  if (__stream == (FILE *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x13;
    pnVar3 = &err_code_s::NameMap;
    eVar5 = err_code_s::NameMap.Arr[0].ItemVal;
    if (err_code_s::NameMap.Arr[0].ItemVal != FileOpenFailed) {
      lVar8 = 0;
      do {
        if (lVar8 == 0x1e0) {
          eVar5 = __Invalid__;
          goto LAB_0019b5bd;
        }
        piVar1 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar8);
        lVar8 = lVar8 + 0x18;
      } while (*piVar1 != 0xd);
      eVar5 = FileOpenFailed;
    }
LAB_0019b5bd:
    if (err_code_s::NameMap.Arr[0].ItemVal != eVar5) {
      lVar8 = 0;
      do {
        lVar6 = lVar8;
        if (lVar6 == 0x1e0) goto LAB_0019b9af;
        lVar8 = lVar6 + 0x18;
      } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar6) != eVar5);
      pnVar3 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar6);
    }
    lVar8 = *in_FS_OFFSET;
    iVar2 = snprintf((char *)(lVar8 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                     (ulong)(uint)pnVar3->Arr[0].Name.Size,pnVar3->Arr[0].Name.field_0.Ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                     ,0x13);
    pcVar11 = "%s";
    snprintf((char *)(lVar8 + -0xf80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
    uVar9 = 0x1000000000d;
    goto LAB_0019b65f;
  }
  iVar2 = fseeko(__stream,0,2);
  if (iVar2 == 0) {
    sVar4 = ftello(__stream);
    if (sVar4 == 0xffffffffffffffff) {
      *(char **)(*in_FS_OFFSET + -0x400) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x1a;
      pnVar3 = &err_code_s::NameMap;
      eVar5 = err_code_s::NameMap.Arr[0].ItemVal;
      if (err_code_s::NameMap.Arr[0].ItemVal != FileTellFailed) {
        lVar8 = 0;
        do {
          if (lVar8 == 0x1e0) {
            eVar5 = __Invalid__;
            goto LAB_0019b852;
          }
          piVar1 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar8);
          lVar8 = lVar8 + 0x18;
        } while (*piVar1 != 0x10);
        eVar5 = FileTellFailed;
      }
LAB_0019b852:
      if (err_code_s::NameMap.Arr[0].ItemVal != eVar5) {
        lVar8 = 0;
        do {
          lVar6 = lVar8;
          if (lVar6 == 0x1e0) goto LAB_0019b9af;
          lVar8 = lVar6 + 0x18;
        } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar6) != eVar5);
        pnVar3 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar6);
      }
      lVar8 = *in_FS_OFFSET;
      iVar2 = snprintf((char *)(lVar8 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)pnVar3->Arr[0].Name.Size,pnVar3->Arr[0].Name.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                       ,0x1a);
      pcVar11 = "%s";
      snprintf((char *)(lVar8 + -0xf80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
      uVar9 = 0x10000000010;
      goto LAB_0019b65f;
    }
    iVar2 = fseeko(__stream,0,0);
    Buf_00 = local_48;
    if (iVar2 == 0) {
      if (local_48->Bytes < (long)sVar4) {
        if (Mallocator()::Instance == '\0') {
          ReadFile();
        }
        AllocBuf(Buf_00,sVar4,(allocator *)&Mallocator()::Instance);
      }
      local_40.Func.Buf = &local_48;
      local_40.Dismissed = false;
      sVar4 = fread(local_48->Data,sVar4,1,__stream);
      if (sVar4 == 1) {
        local_40.Dismissed = true;
        *(char **)(*in_FS_OFFSET + -0x400) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x26;
        pcVar11 = "";
        uVar9 = 0;
      }
      else {
        *(char **)(*in_FS_OFFSET + -0x400) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x23;
        pnVar3 = &err_code_s::NameMap;
        eVar5 = err_code_s::NameMap.Arr[0].ItemVal;
        if (err_code_s::NameMap.Arr[0].ItemVal != FileReadFailed) {
          lVar8 = 0;
          do {
            if (lVar8 == 0x1e0) {
              eVar5 = __Invalid__;
              goto LAB_0019b8fe;
            }
            piVar1 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar8);
            lVar8 = lVar8 + 0x18;
          } while (*piVar1 != 0xb);
          eVar5 = FileReadFailed;
        }
LAB_0019b8fe:
        if (err_code_s::NameMap.Arr[0].ItemVal != eVar5) {
          lVar8 = 0;
          do {
            lVar6 = lVar8;
            if (lVar6 == 0x1e0) goto LAB_0019b9af;
            lVar8 = lVar6 + 0x18;
          } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar6) != eVar5);
          pnVar3 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar6);
        }
        lVar8 = *in_FS_OFFSET;
        iVar2 = snprintf((char *)(lVar8 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                         (ulong)(uint)pnVar3->Arr[0].Name.Size,pnVar3->Arr[0].Name.field_0.Ptr,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                         ,0x23);
        pcVar11 = "%s";
        snprintf((char *)(lVar8 + -0xf80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
        uVar9 = 0x1000000000b;
      }
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp:33:3)>
      ::~scope_guard(&local_40);
      goto LAB_0019b65f;
    }
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x1c;
    pnVar3 = &err_code_s::NameMap;
    eVar5 = err_code_s::NameMap.Arr[0].ItemVal;
    if (err_code_s::NameMap.Arr[0].ItemVal != FileSeekFailed) {
      lVar8 = 0;
      do {
        if (lVar8 == 0x1e0) {
          eVar5 = __Invalid__;
          goto LAB_0019b7fa;
        }
        piVar1 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar8);
        lVar8 = lVar8 + 0x18;
      } while (*piVar1 != 0xf);
      eVar5 = FileSeekFailed;
    }
LAB_0019b7fa:
    if (err_code_s::NameMap.Arr[0].ItemVal != eVar5) {
      lVar8 = 0;
      do {
        lVar6 = lVar8;
        if (lVar6 == 0x1e0) goto LAB_0019b9af;
        lVar8 = lVar6 + 0x18;
      } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar6) != eVar5);
      pnVar3 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar6);
    }
    pcVar10 = pnVar3->Arr[0].Name.field_0.Ptr;
    uVar7 = pnVar3->Arr[0].Name.Size;
    lVar8 = *in_FS_OFFSET;
    uVar13 = 0x1c;
  }
  else {
    *(char **)(*in_FS_OFFSET + -0x400) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x17;
    pnVar3 = &err_code_s::NameMap;
    eVar5 = err_code_s::NameMap.Arr[0].ItemVal;
    if (err_code_s::NameMap.Arr[0].ItemVal != FileSeekFailed) {
      lVar8 = 0;
      do {
        if (lVar8 == 0x1e0) {
          eVar5 = __Invalid__;
          goto LAB_0019b511;
        }
        piVar1 = (int *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar8);
        lVar8 = lVar8 + 0x18;
      } while (*piVar1 != 0xf);
      eVar5 = FileSeekFailed;
    }
LAB_0019b511:
    if (err_code_s::NameMap.Arr[0].ItemVal != eVar5) {
      lVar8 = 0;
      do {
        lVar6 = lVar8;
        if (lVar6 == 0x1e0) {
LAB_0019b9af:
          __assert_fail("It != End(EnumS.NameMap)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/ErrorCodes.h"
                        ,0xc,"stref idx2::ToString(err_code)");
        }
        lVar8 = lVar6 + 0x18;
      } while (*(err_code *)((long)&err_code_s::NameMap.Arr[1].ItemVal + lVar6) != eVar5);
      pnVar3 = (name_map *)((long)&err_code_s::NameMap.Arr[1].Name.field_0 + lVar6);
    }
    pcVar10 = pnVar3->Arr[0].Name.field_0.Ptr;
    uVar7 = pnVar3->Arr[0].Name.Size;
    lVar8 = *in_FS_OFFSET;
    uVar13 = 0x17;
  }
  iVar2 = snprintf((char *)(lVar8 + -0xf80),0x400,"%.*s (file %s, line %d): ",(ulong)uVar7,pcVar10,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.cpp"
                   ,uVar13);
  pcVar11 = "%s";
  snprintf((char *)(lVar8 + -0xf80) + iVar2,0x400 - (long)iVar2,"%s",FileName);
  uVar9 = 0x1000000000f;
LAB_0019b65f:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  eVar12.Code = (int)uVar9;
  eVar12.StackIdx = (char)((ulong)uVar9 >> 0x20);
  eVar12.StrGened = (bool)(char)((ulong)uVar9 >> 0x28);
  eVar12._14_2_ = (short)((ulong)uVar9 >> 0x30);
  eVar12.Msg = pcVar11;
  return eVar12;
}

Assistant:

error<>
ReadFile(cstr FileName, buffer* Buf)
{
  idx2_Assert((Buf->Data && Buf->Bytes) || (!Buf->Data && !Buf->Bytes));

  FILE* Fp = fopen(FileName, "rb");
  idx2_CleanUp(if (Fp) fclose(Fp));
  if (!Fp)
    return idx2_Error(err_code::FileOpenFailed, "%s", FileName);

  /* Determine the file size */
  if (idx2_FSeek(Fp, 0, SEEK_END))
    return idx2_Error(err_code::FileSeekFailed, "%s", FileName);
  i64 Size = 0;
  if ((Size = idx2_FTell(Fp)) == -1)
    return idx2_Error(err_code::FileTellFailed, "%s", FileName);
  if (idx2_FSeek(Fp, 0, SEEK_SET))
    return idx2_Error(err_code::FileSeekFailed, "%s", FileName);
  if (Buf->Bytes < Size)
    AllocBuf(Buf, Size);

  /* Read file contents */
  idx2_CleanUp(1, DeallocBuf(Buf));
  if (fread(Buf->Data, size_t(Size), 1, Fp) != 1)
    return idx2_Error(err_code::FileReadFailed, "%s", FileName);

  idx2_DismissCleanUp(1);
  return idx2_Error(err_code::NoError);
}